

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86_avx2.cpp
# Opt level: O0

void ncnn::crop_pack8_avx(Mat *src,Mat *dst,int top,int left)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int in_ECX;
  int in_EDX;
  Mat *in_RSI;
  Mat *in_RDI;
  __m256 _p;
  int x;
  int y;
  float *outptr;
  float *ptr;
  int right;
  int h;
  int w;
  int local_a8;
  int local_a4;
  float *local_a0;
  float *local_98;
  
  iVar1 = in_RSI->w;
  iVar2 = in_RSI->h;
  iVar3 = in_RDI->w;
  iVar4 = in_RSI->w;
  local_98 = Mat::row(in_RDI,in_EDX);
  local_98 = local_98 + (in_ECX << 3);
  local_a0 = Mat::operator_cast_to_float_(in_RSI);
  for (local_a4 = 0; local_a4 < iVar2; local_a4 = local_a4 + 1) {
    for (local_a8 = 0; local_a8 < iVar1; local_a8 = local_a8 + 1) {
      uVar5 = *(undefined8 *)(local_98 + 2);
      uVar6 = *(undefined8 *)(local_98 + 4);
      uVar7 = *(undefined8 *)(local_98 + 6);
      *(undefined8 *)local_a0 = *(undefined8 *)local_98;
      *(undefined8 *)(local_a0 + 2) = uVar5;
      *(undefined8 *)(local_a0 + 4) = uVar6;
      *(undefined8 *)(local_a0 + 6) = uVar7;
      local_98 = local_98 + 8;
      local_a0 = local_a0 + 8;
    }
    local_98 = local_98 + (iVar3 - iVar4) * 8;
  }
  return;
}

Assistant:

static void crop_pack8_avx(const Mat& src, Mat& dst, int top, int left)
{
    int w = dst.w;
    int h = dst.h;
    int right = src.w - dst.w - left;

    const float* ptr = src.row(top) + left * 8;
    float* outptr = dst;

    for (int y = 0; y < h; y++)
    {
        for (int x = 0; x < w; x++)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(outptr, _p);
            ptr += 8;
            outptr += 8;
        }

        ptr += (left + right) * 8;
    }
}